

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# G2.c
# Opt level: O0

int G2_windowed_mul(G2 *r,BIGNUM *scalar,G2 *Q,ATE_CTX *ctx)

{
  unsigned_long uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  BN_CTX *ctx_00;
  BIGNUM *r_00;
  unsigned_long *puVar5;
  long in_RCX;
  BIGNUM *in_RSI;
  void *in_RDI;
  uint off;
  unsigned_long d;
  BIGNUM *mod;
  G2 *row;
  BN_CTX *bn_ctx;
  uchar table_storage [4096];
  G2 *table;
  BIGNUM *scalars;
  G2 *temp;
  uint wvalue;
  uint mask;
  uint window_size;
  uchar p_str [33];
  uint idx;
  int num;
  int ret;
  int j;
  size_t i;
  G2 *in_stack_ffffffffffffef28;
  fp2_struct_st *pfVar6;
  G2 *in_stack_ffffffffffffef30;
  fp2_struct_st *rop;
  undefined1 local_1098 [64];
  fp2_struct_st fStack_1058;
  ATE_CTX *in_stack_fffffffffffff020;
  G2 *in_stack_fffffffffffff028;
  G2 *in_stack_fffffffffffff030;
  ATE_CTX *in_stack_fffffffffffff1a8;
  G2 *in_stack_fffffffffffff1b0;
  G2 *in_stack_fffffffffffff1b8;
  G2 *in_stack_fffffffffffff1c0;
  fp2_struct_st afStack_458 [15];
  fp2_struct_st *local_90;
  BIGNUM *local_88;
  fp2_struct_st *local_80;
  uint local_74;
  undefined4 local_70;
  undefined4 local_6c;
  byte local_68 [31];
  byte bStack_49;
  uint local_38;
  int local_34;
  int local_30;
  int local_2c;
  ulong local_28;
  long local_20;
  BIGNUM *local_10;
  void *local_8;
  
  local_30 = 0;
  local_34 = 1;
  local_6c = 5;
  local_70 = 0x3f;
  local_88 = (BIGNUM *)0x0;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ctx_00 = BN_CTX_new();
  local_90 = (fp2_struct_st *)((long)&fStack_1058 + -((ulong)local_1098 & 0x3f));
  local_80 = (fp2_struct_st *)((long)afStack_458 + -((ulong)local_1098 & 0x3f));
  for (local_28 = 0; pfVar6 = local_90, local_28 < (ulong)(long)local_34; local_28 = local_28 + 1) {
    iVar2 = BN_num_bits(local_10);
    if ((iVar2 < 0x101) && (iVar2 = BN_is_negative((BIGNUM *)local_10), iVar2 == 0)) {
      local_88 = (BIGNUM *)local_10;
      r_00 = local_88;
    }
    else {
      r_00 = (BIGNUM *)BN_CTX_get(ctx_00);
      if ((r_00 == (BIGNUM *)0x0) ||
         (iVar2 = BN_nnmod((BIGNUM *)r_00,local_10,*(BIGNUM **)(local_20 + 0x350),ctx_00),
         iVar2 == 0)) goto LAB_00127b7c;
    }
    local_88 = r_00;
    for (local_2c = 0; iVar2 = local_2c, iVar3 = bn_get_top(local_88), iVar2 < iVar3 * 8;
        local_2c = local_2c + 8) {
      puVar5 = bn_get_words(local_88);
      uVar1 = puVar5[local_2c / 8];
      local_68[local_2c] = (byte)uVar1;
      local_68[local_2c + 1] = (byte)(uVar1 >> 8);
      local_68[local_2c + 2] = (byte)(uVar1 >> 0x10);
      local_68[local_2c + 3] = (byte)(uVar1 >> 0x18);
      local_68[local_2c + 4] = (byte)(uVar1 >> 0x20);
      local_68[local_2c + 5] = (byte)(uVar1 >> 0x28);
      local_68[local_2c + 6] = (byte)(uVar1 >> 0x30);
      local_68[local_2c + 7] = (byte)(uVar1 >> 0x38);
    }
    for (; local_2c < 0x21; local_2c = local_2c + 1) {
      local_68[local_2c] = 0;
    }
    G2_copy(in_stack_ffffffffffffef30,in_stack_ffffffffffffef28);
    G2_scatter_w5(pfVar6,local_80,1);
    G2_double(in_stack_fffffffffffff030,in_stack_fffffffffffff028,in_stack_fffffffffffff020);
    G2_scatter_w5(pfVar6,local_80 + 3,2);
    G2_add(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
           in_stack_fffffffffffff1a8);
    G2_scatter_w5(pfVar6,local_80 + 6,3);
    G2_double(in_stack_fffffffffffff030,in_stack_fffffffffffff028,in_stack_fffffffffffff020);
    G2_scatter_w5(pfVar6,local_80 + 3,4);
    G2_double(in_stack_fffffffffffff030,in_stack_fffffffffffff028,in_stack_fffffffffffff020);
    G2_scatter_w5(pfVar6,local_80 + 6,6);
    G2_add(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
           in_stack_fffffffffffff1a8);
    G2_scatter_w5(pfVar6,local_80 + 9,5);
    G2_add(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
           in_stack_fffffffffffff1a8);
    G2_scatter_w5(pfVar6,local_80 + 0xc,7);
    G2_double(in_stack_fffffffffffff030,in_stack_fffffffffffff028,in_stack_fffffffffffff020);
    G2_scatter_w5(pfVar6,local_80 + 3,8);
    G2_double(in_stack_fffffffffffff030,in_stack_fffffffffffff028,in_stack_fffffffffffff020);
    G2_scatter_w5(pfVar6,local_80 + 6,0xc);
    G2_double(in_stack_fffffffffffff030,in_stack_fffffffffffff028,in_stack_fffffffffffff020);
    G2_scatter_w5(pfVar6,local_80 + 9,10);
    G2_double(in_stack_fffffffffffff030,in_stack_fffffffffffff028,in_stack_fffffffffffff020);
    G2_scatter_w5(pfVar6,local_80 + 0xc,0xe);
    G2_add(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
           in_stack_fffffffffffff1a8);
    G2_scatter_w5(pfVar6,local_80 + 6,0xd);
    G2_add(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
           in_stack_fffffffffffff1a8);
    G2_scatter_w5(pfVar6,local_80 + 9,0xb);
    G2_add(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
           in_stack_fffffffffffff1a8);
    G2_scatter_w5(pfVar6,local_80 + 0xc,0xf);
    G2_add(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
           in_stack_fffffffffffff1a8);
    G2_scatter_w5(pfVar6,local_80 + 6,9);
    G2_double(in_stack_fffffffffffff030,in_stack_fffffffffffff028,in_stack_fffffffffffff020);
    G2_scatter_w5(pfVar6,local_80 + 3,0x10);
  }
  local_38 = 0xff;
  local_74 = (uint)(bStack_49 >> 6);
  pfVar6 = local_80;
  rop = local_90;
  uVar4 = _booth_recode_w5(local_74);
  G2_gather_w5(pfVar6,rop,uVar4 >> 1);
  memcpy(local_8,local_80,0xc0);
  while (4 < local_38) {
    for (local_28 = (long)(int)(uint)(local_38 == 0xff); local_28 == 0; local_28 = local_28 + 1) {
      uVar4 = local_38 - 1 >> 3;
      local_74 = (ushort)(CONCAT11(local_68[uVar4 + 1],local_68[uVar4]) >> ((char)local_38 - 1U & 7)
                         ) & 0x3f;
      local_74 = _booth_recode_w5(local_74);
      G2_gather_w5(local_80,local_90,local_74 >> 1);
      fp2_neg(rop,pfVar6,(fp_struct_st *)0x12797d);
      copy_conditional((unsigned_long *)(local_80 + 1),(unsigned_long *)(local_80 + 4),
                       (ulong)(local_74 & 1));
      G2_add(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
             in_stack_fffffffffffff1a8);
    }
    local_38 = local_38 - 5;
    G2_double(in_stack_fffffffffffff030,in_stack_fffffffffffff028,in_stack_fffffffffffff020);
    G2_double(in_stack_fffffffffffff030,in_stack_fffffffffffff028,in_stack_fffffffffffff020);
    G2_double(in_stack_fffffffffffff030,in_stack_fffffffffffff028,in_stack_fffffffffffff020);
    G2_double(in_stack_fffffffffffff030,in_stack_fffffffffffff028,in_stack_fffffffffffff020);
    G2_double(in_stack_fffffffffffff030,in_stack_fffffffffffff028,in_stack_fffffffffffff020);
  }
  local_74 = (local_68[0] & 0x1f) << 1;
  local_74 = _booth_recode_w5(local_74);
  G2_gather_w5(local_80,local_90,local_74 >> 1);
  fp2_neg(rop,pfVar6,(fp_struct_st *)0x127b1a);
  copy_conditional((unsigned_long *)(local_80 + 1),(unsigned_long *)(local_80 + 4),
                   (ulong)(local_74 & 1));
  G2_add(in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0,
         in_stack_fffffffffffff1a8);
  local_30 = 1;
LAB_00127b7c:
  BN_CTX_free(ctx_00);
  return local_30;
}

Assistant:

static int G2_windowed_mul(G2 *r, const BIGNUM *scalar, const G2 *Q, const ATE_CTX *ctx)
{
    size_t i;
    int j, ret = 0, num = 1;
    unsigned int idx;
    unsigned char p_str[33];
    const unsigned int window_size = 5;
    const unsigned int mask = (1 << (window_size + 1)) - 1;
    unsigned int wvalue;
    G2 *temp;           /* place for 5 temporary points */
    const BIGNUM *scalars = NULL;
    G2 *table;
   // void *table_storage = NULL;
    unsigned char table_storage[(16 + 5) * sizeof(G2) + 64];
    BN_CTX *bn_ctx = BN_CTX_new();

    table = (void *)ALIGNPTR(table_storage, 64);
    temp = table + 16;

    for (i = 0; i < num; i++) {
        G2 *row = table;

        /* This is an unusual input, we don't guarantee constant-timeness. */
        if ((BN_num_bits(scalar) > 256) || BN_is_negative(scalar)) {
            BIGNUM *mod;

            if ((mod = BN_CTX_get(bn_ctx)) == NULL)
                goto err;
            if (!BN_nnmod(mod, scalar, ctx->order, bn_ctx)) {
                // //ECerr(EC_F_ECP_SM2Z256_WINDOWED_MUL, ERR_R_BN_LIB);
                goto err;
            }
            scalars = mod;
        } else
        scalars = scalar;

        for (j = 0; j < bn_get_top(scalars) * BN_BYTES; j += BN_BYTES) {
            BN_ULONG d = bn_get_words(scalars)[j / BN_BYTES];

            p_str[j + 0] = (unsigned char)d;
            p_str[j + 1] = (unsigned char)(d >> 8);
            p_str[j + 2] = (unsigned char)(d >> 16);
            p_str[j + 3] = (unsigned char)(d >>= 24);
            if (BN_BYTES == 8) {
                d >>= 8;
                p_str[j + 4] = (unsigned char)d;
                p_str[j + 5] = (unsigned char)(d >> 8);
                p_str[j + 6] = (unsigned char)(d >> 16);
                p_str[j + 7] = (unsigned char)(d >> 24);
            }
        }
        for (; j < 33; j++)
            p_str[j] = 0;

        G2_copy(&temp[0], Q);

        /*
         * row[0] is implicitly (0,0,0) (the point at infinity), therefore it
         * is not stored. All other values are actually stored with an offset
         * of -1 in table.
         */
        G2_scatter_w5  (row, &temp[0], 1);
        G2_double(&temp[1], &temp[0], ctx);              /*1+1=2  */
        G2_scatter_w5  (row, &temp[1], 2);
        G2_add   (&temp[2], &temp[1], &temp[0], ctx);    /*2+1=3  */
        G2_scatter_w5  (row, &temp[2], 3);
        G2_double(&temp[1], &temp[1], ctx);              /*2*2=4  */
        G2_scatter_w5  (row, &temp[1], 4);
        G2_double(&temp[2], &temp[2], ctx);              /*2*3=6  */
        G2_scatter_w5  (row, &temp[2], 6);
        G2_add   (&temp[3], &temp[1], &temp[0], ctx);    /*4+1=5  */
        G2_scatter_w5  (row, &temp[3], 5);
        G2_add   (&temp[4], &temp[2], &temp[0], ctx);    /*6+1=7  */
        G2_scatter_w5  (row, &temp[4], 7);
        G2_double(&temp[1], &temp[1], ctx);              /*2*4=8  */
        G2_scatter_w5  (row, &temp[1], 8);
        G2_double(&temp[2], &temp[2], ctx);              /*2*6=12 */
        G2_scatter_w5  (row, &temp[2], 12);
        G2_double(&temp[3], &temp[3], ctx);              /*2*5=10 */
        G2_scatter_w5  (row, &temp[3], 10);
        G2_double(&temp[4], &temp[4], ctx);              /*2*7=14 */
        G2_scatter_w5  (row, &temp[4], 14);
        G2_add   (&temp[2], &temp[2], &temp[0], ctx);    /*12+1=13*/
        G2_scatter_w5  (row, &temp[2], 13);
        G2_add   (&temp[3], &temp[3], &temp[0], ctx);    /*10+1=11*/
        G2_scatter_w5  (row, &temp[3], 11);
        G2_add   (&temp[4], &temp[4], &temp[0], ctx);    /*14+1=15*/
        G2_scatter_w5  (row, &temp[4], 15);
        G2_add   (&temp[2], &temp[1], &temp[0], ctx);    /*8+1=9  */
        G2_scatter_w5  (row, &temp[2], 9);
        G2_double(&temp[1], &temp[1], ctx);              /*2*8=16 */
        G2_scatter_w5  (row, &temp[1], 16);
    }

    idx = 255;

    wvalue = p_str[(idx - 1) / 8];
    wvalue = (wvalue >> ((idx - 1) % 8)) & mask;
    /*
     * We gather to temp[0], because we know it's position relative
     * to table
     */
    G2_gather_w5(&temp[0], table, _booth_recode_w5(wvalue) >> 1);
    memcpy(r, &temp[0], sizeof(temp[0]));

    while (idx >= 5) {
        for (i = (idx == 255 ? 1 : 0); i < 1; i++) {
            unsigned int off = (idx - 1) / 8;

            wvalue = p_str[off] | p_str[off + 1] << 8;
            wvalue = (wvalue >> ((idx - 1) % 8)) & mask;

            wvalue = _booth_recode_w5(wvalue);

            G2_gather_w5(&temp[0], table, wvalue >> 1);

            fp2_neg(temp[1].m_y, temp[0].m_y, ctx->p);
            copy_conditional((BN_ULONG*)temp[0].m_y, (BN_ULONG*)temp[1].m_y, (wvalue & 1));

            G2_add(r, r, &temp[0], ctx);
        }

        idx -= window_size;
        
        G2_double(r, r, ctx);
        G2_double(r, r, ctx);
        G2_double(r, r, ctx);
        G2_double(r, r, ctx);
        G2_double(r, r, ctx);
    }

    /* Final window */
    wvalue = p_str[0];
    wvalue = (wvalue << 1) & mask;

    wvalue = _booth_recode_w5(wvalue);
    G2_gather_w5(&temp[0], table, wvalue >> 1);

    fp2_neg(temp[1].m_y, temp[0].m_y, ctx->p);
    copy_conditional((BN_ULONG*)temp[0].m_y, (BN_ULONG*)temp[1].m_y, (wvalue & 1));

    G2_add(r, r, &temp[0], ctx);

    ret = GML_OK;
err:
    BN_CTX_free(bn_ctx);
    return ret;
}